

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double chi_cdf_inv(double cdf,double a,double b,double c)

{
  double dVar1;
  double dVar2;
  double x3;
  double x2;
  double x1;
  double x;
  double tol;
  double r8_huge;
  int it_max;
  int it;
  double cdf3;
  double cdf2;
  double cdf1;
  double c_local;
  double b_local;
  double a_local;
  double cdf_local;
  
  if ((0.0 <= cdf) && (cdf <= 1.0)) {
    if ((cdf != 0.0) || (cdf_local = a, NAN(cdf))) {
      if ((cdf != 1.0) || (NAN(cdf))) {
        cdf2 = 0.0;
        x3 = a + 1.0;
        while (dVar1 = chi_cdf(x3,a,b,c), dVar1 <= cdf) {
          x3 = (x3 - a) + (x3 - a) + a;
        }
        r8_huge._4_4_ = 0;
        dVar1 = x3;
        x2 = a;
        while( true ) {
          x3 = dVar1;
          r8_huge._4_4_ = r8_huge._4_4_ + 1;
          cdf_local = (x2 + x3) * 0.5;
          dVar2 = chi_cdf(cdf_local,a,b,c);
          if (ABS(dVar2 - cdf) < 0.0001) break;
          if (100 < r8_huge._4_4_) {
            std::operator<<((ostream *)&std::cerr," \n");
            std::operator<<((ostream *)&std::cerr,"CHI_CDF_INV - Fatal error!\n");
            std::operator<<((ostream *)&std::cerr,"  Iteration limit exceeded.\n");
            return 0.0;
          }
          if (((dVar2 <= cdf) && (cdf2 <= cdf)) ||
             ((dVar1 = cdf_local, cdf <= dVar2 && (cdf <= cdf2)))) {
            dVar1 = x3;
            x2 = cdf_local;
            cdf2 = dVar2;
          }
        }
      }
      else {
        cdf_local = 1e+30;
      }
    }
    return cdf_local;
  }
  std::operator<<((ostream *)&std::cerr," \n");
  std::operator<<((ostream *)&std::cerr,"CHI_CDF_INV - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  CDF < 0 or 1 < CDF.\n");
  exit(1);
}

Assistant:

double chi_cdf_inv ( double cdf, double a, double b, double c )

//****************************************************************************80
//
//  Purpose:
//
//    CHI_CDF_INV inverts the Chi CDF.
//
//  Discussion:
//
//    A simple bisection method is used.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    12 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double CDF, the value of the CDF.
//
//    Input, double A, B, C, the parameters of the PDF.
//    0 < B,
//    0 < C.
//
//    Output, double CHI_CDF_INV, the corresponding argument of the CDF.
//
{
  double cdf1;
  double cdf2;
  double cdf3;
  int it;
  int it_max = 100;
  const double r8_huge = 1.0E+30;
  double tol = 0.0001;
  double x;
  double x1;
  double x2;
  double x3;

  x = 0.0;

  if ( cdf < 0.0 || 1.0 < cdf )
  {
    cerr << " \n";
    cerr << "CHI_CDF_INV - Fatal error!\n";
    cerr << "  CDF < 0 or 1 < CDF.\n";
    exit ( 1 );
  }

  if ( cdf == 0.0 )
  {
    x = a;
    return x;
  }
  else if ( 1.0 == cdf )
  {
    x = r8_huge;
    return x;
  }

  x1 = a;
  cdf1 = 0.0;

  x2 = a + 1.0;

  for ( ; ; )
  {
    cdf2 = chi_cdf ( x2, a, b, c );

    if ( cdf < cdf2 )
    {
      break;
    }

    x2 = a + 2.0 * ( x2 - a );
  }
//
//  Now use bisection.
//
  it = 0;

  for ( ; ; )
  {
    it = it + 1;

    x3 = 0.5 * ( x1 + x2 );
    cdf3 = chi_cdf ( x3, a, b, c );

    if ( fabs ( cdf3 - cdf ) < tol )
    {
      x = x3;
      break;
    }

    if ( it_max < it )
    {
      cerr << " \n";
      cerr << "CHI_CDF_INV - Fatal error!\n";
      cerr << "  Iteration limit exceeded.\n";
      return x;
    }

    if ( ( cdf3 <= cdf && cdf1 <= cdf ) || ( cdf <= cdf3 && cdf <= cdf1 ) )
    {
      x1 = x3;
      cdf1 = cdf3;
    }
    else
    {
      x2 = x3;
      cdf2 = cdf3;
    }

  }

  return x;
}